

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O1

void __thiscall
capnp::TwoPartyVatNetwork::OutgoingMessageImpl::setFds(OutgoingMessageImpl *this,Array<int> *fds)

{
  TwoPartyVatNetwork *pTVar1;
  int *piVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  pTVar1 = this->network;
  if (pTVar1->maxFdsPerMessage != 0) {
    piVar2 = (this->fds).ptr;
    if (piVar2 != (int *)0x0) {
      sVar3 = (this->fds).size_;
      (this->fds).ptr = (int *)0x0;
      (this->fds).size_ = 0;
      pAVar4 = (this->fds).disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,piVar2,4,sVar3,sVar3,0,pTVar1);
    }
    (this->fds).ptr = fds->ptr;
    (this->fds).size_ = fds->size_;
    (this->fds).disposer = fds->disposer;
    fds->ptr = (int *)0x0;
    fds->size_ = 0;
  }
  return;
}

Assistant:

void setFds(kj::Array<int> fds) override {
    if (network.maxFdsPerMessage > 0) {
      this->fds = kj::mv(fds);
    }
  }